

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sw_stats_striped_avx2_256_8.c
# Opt level: O1

parasail_result_t *
parasail_sw_stats_rowcol_striped_profile_avx2_256_8
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  undefined1 auVar1 [32];
  __m256i alVar2;
  __m256i alVar3;
  __m256i alVar4;
  __m256i alVar5;
  void *pvVar6;
  parasail_matrix_t *ppVar7;
  void *pvVar8;
  void *pvVar9;
  bool bVar10;
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  __m256i c;
  __m256i c_00;
  __m256i c_01;
  __m256i c_02;
  __m256i vH;
  __m256i vH_00;
  __m256i vH_01;
  __m256i vH_02;
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  __m256i *palVar16;
  int iVar17;
  uint uVar18;
  parasail_result_t *result;
  __m256i *b;
  __m256i *b_00;
  __m256i *palVar19;
  __m256i *b_01;
  __m256i *palVar20;
  __m256i *b_02;
  __m256i *palVar21;
  __m256i *b_03;
  __m256i *b_04;
  __m256i *b_05;
  __m256i *b_06;
  long lVar22;
  char cVar23;
  uint uVar24;
  int iVar25;
  __m256i *palVar26;
  __m256i *ptr;
  ulong uVar27;
  uint seglen;
  ulong size;
  __m256i *ptr_00;
  char cVar28;
  int iVar29;
  char cVar30;
  long lVar31;
  ulong uVar32;
  uint uVar33;
  ulong uVar34;
  uint uVar35;
  __m256i *ptr_01;
  int iVar36;
  int iVar37;
  __m256i *ptr_02;
  __m256i *ptr_03;
  undefined1 uVar38;
  undefined1 uVar39;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar45 [16];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [64];
  undefined1 auVar51 [32];
  char cVar55;
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [64];
  undefined1 auVar56 [64];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [64];
  undefined1 auVar60 [64];
  int32_t column_len;
  undefined4 in_stack_fffffffffffffd38;
  undefined4 in_stack_fffffffffffffd3c;
  __m256i *palVar61;
  undefined4 in_stack_fffffffffffffd50;
  undefined4 in_stack_fffffffffffffd54;
  __m256i *local_2a8;
  __m256i *local_2a0;
  __m256i *local_290;
  __m256i *local_280;
  __m256i *local_278;
  undefined1 local_268 [32];
  __m256i *local_220;
  __m256i *local_210;
  int local_208;
  char local_1e8;
  undefined1 local_b8 [32];
  undefined1 auVar42 [32];
  
  if (profile == (parasail_profile_t *)0x0) {
    parasail_sw_stats_rowcol_striped_profile_avx2_256_8_cold_8();
  }
  else {
    pvVar6 = (profile->profile8).score;
    if (pvVar6 == (void *)0x0) {
      parasail_sw_stats_rowcol_striped_profile_avx2_256_8_cold_7();
    }
    else {
      ppVar7 = profile->matrix;
      if (ppVar7 == (parasail_matrix_t *)0x0) {
        parasail_sw_stats_rowcol_striped_profile_avx2_256_8_cold_6();
      }
      else {
        uVar33 = profile->s1Len;
        uVar34 = (ulong)uVar33;
        if ((int)uVar33 < 1) {
          parasail_sw_stats_rowcol_striped_profile_avx2_256_8_cold_5();
        }
        else if (s2 == (char *)0x0) {
          parasail_sw_stats_rowcol_striped_profile_avx2_256_8_cold_4();
        }
        else if (s2Len < 1) {
          parasail_sw_stats_rowcol_striped_profile_avx2_256_8_cold_3();
        }
        else if (open < 0) {
          parasail_sw_stats_rowcol_striped_profile_avx2_256_8_cold_2();
        }
        else if (gap < 0) {
          parasail_sw_stats_rowcol_striped_profile_avx2_256_8_cold_1();
        }
        else {
          uVar27 = uVar34 + 0x1f;
          size = uVar27 >> 5;
          seglen = (uint)size;
          iVar17 = (int)(uVar33 - 1) / (int)seglen;
          uVar35 = (int)(uVar33 - 1) % (int)seglen;
          pvVar8 = (profile->profile8).matches;
          pvVar9 = (profile->profile8).similar;
          iVar37 = ppVar7->max;
          result = parasail_result_new_rowcol3((uint)uVar27 & 0x7fffffe0,s2Len);
          if (result != (parasail_result_t *)0x0) {
            result->flag = result->flag | 0x20150804;
            b = parasail_memalign___m256i(0x20,size);
            local_210 = parasail_memalign___m256i(0x20,size);
            b_00 = parasail_memalign___m256i(0x20,size);
            palVar19 = parasail_memalign___m256i(0x20,size);
            b_01 = parasail_memalign___m256i(0x20,size);
            palVar20 = parasail_memalign___m256i(0x20,size);
            b_02 = parasail_memalign___m256i(0x20,size);
            palVar21 = parasail_memalign___m256i(0x20,size);
            b_03 = parasail_memalign___m256i(0x20,size);
            b_04 = parasail_memalign___m256i(0x20,size);
            b_05 = parasail_memalign___m256i(0x20,size);
            b_06 = parasail_memalign___m256i(0x20,size);
            local_2a0 = parasail_memalign___m256i(0x20,size);
            local_290 = parasail_memalign___m256i(0x20,size);
            local_2a8 = parasail_memalign___m256i(0x20,size);
            local_220 = parasail_memalign___m256i(0x20,size);
            if (b == (__m256i *)0x0) {
              return (parasail_result_t *)0x0;
            }
            if (local_210 == (__m256i *)0x0) {
              return (parasail_result_t *)0x0;
            }
            if (b_00 == (__m256i *)0x0) {
              return (parasail_result_t *)0x0;
            }
            if (palVar19 == (__m256i *)0x0) {
              return (parasail_result_t *)0x0;
            }
            if (b_01 == (__m256i *)0x0) {
              return (parasail_result_t *)0x0;
            }
            if (palVar20 == (__m256i *)0x0) {
              return (parasail_result_t *)0x0;
            }
            if (b_02 == (__m256i *)0x0) {
              return (parasail_result_t *)0x0;
            }
            if (palVar21 == (__m256i *)0x0) {
              return (parasail_result_t *)0x0;
            }
            if (b_03 == (__m256i *)0x0) {
              return (parasail_result_t *)0x0;
            }
            if (b_04 == (__m256i *)0x0) {
              return (parasail_result_t *)0x0;
            }
            if (b_05 == (__m256i *)0x0) {
              return (parasail_result_t *)0x0;
            }
            if (b_06 == (__m256i *)0x0) {
              return (parasail_result_t *)0x0;
            }
            if (local_2a0 == (__m256i *)0x0) {
              return (parasail_result_t *)0x0;
            }
            if (local_290 == (__m256i *)0x0) {
              return (parasail_result_t *)0x0;
            }
            if (local_2a8 == (__m256i *)0x0) {
              return (parasail_result_t *)0x0;
            }
            if (local_220 == (__m256i *)0x0) {
              return (parasail_result_t *)0x0;
            }
            iVar36 = 0x1f - iVar17;
            uVar38 = (undefined1)open;
            uVar39 = (undefined1)gap;
            alVar2[0]._4_4_ = in_stack_fffffffffffffd3c;
            alVar2[0]._0_4_ = in_stack_fffffffffffffd38;
            alVar2[1] = (longlong)palVar21;
            alVar2[2] = (longlong)palVar19;
            alVar2[3]._0_4_ = in_stack_fffffffffffffd50;
            alVar2[3]._4_4_ = in_stack_fffffffffffffd54;
            parasail_memset___m256i(b,alVar2,size);
            alVar3[0]._4_4_ = in_stack_fffffffffffffd3c;
            alVar3[0]._0_4_ = in_stack_fffffffffffffd38;
            alVar3[1] = (longlong)palVar21;
            alVar3[2] = (longlong)palVar19;
            alVar3[3]._0_4_ = in_stack_fffffffffffffd50;
            alVar3[3]._4_4_ = in_stack_fffffffffffffd54;
            parasail_memset___m256i(b_00,alVar3,size);
            alVar4[0]._4_4_ = in_stack_fffffffffffffd3c;
            alVar4[0]._0_4_ = in_stack_fffffffffffffd38;
            alVar4[1] = (longlong)palVar21;
            alVar4[2] = (longlong)palVar19;
            alVar4[3]._0_4_ = in_stack_fffffffffffffd50;
            alVar4[3]._4_4_ = in_stack_fffffffffffffd54;
            parasail_memset___m256i(b_01,alVar4,size);
            alVar5[0]._4_4_ = in_stack_fffffffffffffd3c;
            alVar5[0]._0_4_ = in_stack_fffffffffffffd38;
            alVar5[1] = (longlong)palVar21;
            alVar5[2] = (longlong)palVar19;
            alVar5[3]._0_4_ = in_stack_fffffffffffffd50;
            alVar5[3]._4_4_ = in_stack_fffffffffffffd54;
            parasail_memset___m256i(b_02,alVar5,size);
            c[0]._4_4_ = in_stack_fffffffffffffd3c;
            c[0]._0_4_ = in_stack_fffffffffffffd38;
            c[1] = (longlong)palVar21;
            c[2] = (longlong)palVar19;
            c[3]._0_4_ = in_stack_fffffffffffffd50;
            c[3]._4_4_ = in_stack_fffffffffffffd54;
            parasail_memset___m256i(b_03,c,size);
            c_00[0]._4_4_ = in_stack_fffffffffffffd3c;
            c_00[0]._0_4_ = in_stack_fffffffffffffd38;
            c_00[1] = (longlong)palVar21;
            c_00[2] = (longlong)palVar19;
            c_00[3]._0_4_ = in_stack_fffffffffffffd50;
            c_00[3]._4_4_ = in_stack_fffffffffffffd54;
            parasail_memset___m256i(b_04,c_00,size);
            c_01[0]._4_4_ = in_stack_fffffffffffffd3c;
            c_01[0]._0_4_ = in_stack_fffffffffffffd38;
            c_01[1] = (longlong)palVar21;
            c_01[2] = (longlong)palVar19;
            c_01[3]._0_4_ = in_stack_fffffffffffffd50;
            c_01[3]._4_4_ = in_stack_fffffffffffffd54;
            parasail_memset___m256i(b_05,c_01,size);
            c_02[0]._4_4_ = in_stack_fffffffffffffd3c;
            c_02[0]._0_4_ = in_stack_fffffffffffffd38;
            c_02[1] = (longlong)palVar21;
            c_02[2] = (longlong)palVar19;
            c_02[3]._0_4_ = in_stack_fffffffffffffd50;
            c_02[3]._4_4_ = in_stack_fffffffffffffd54;
            parasail_memset___m256i(b_06,c_02,size);
            uVar24 = seglen - 1;
            local_1e8 = (char)iVar37;
            iVar37 = 1;
            if (1 < iVar36) {
              iVar37 = iVar36;
            }
            auVar40[8] = 0x80;
            auVar40._0_8_ = 0x8080808080808080;
            auVar40[9] = 0x80;
            auVar40[10] = 0x80;
            auVar40[0xb] = 0x80;
            auVar40[0xc] = 0x80;
            auVar40[0xd] = 0x80;
            auVar40[0xe] = 0x80;
            auVar40[0xf] = 0x80;
            auVar42[0x10] = 0x80;
            auVar42._0_16_ = auVar40;
            auVar42[0x11] = 0x80;
            auVar42[0x12] = 0x80;
            auVar42[0x13] = 0x80;
            auVar42[0x14] = 0x80;
            auVar42[0x15] = 0x80;
            auVar42[0x16] = 0x80;
            auVar42[0x17] = 0x80;
            auVar42[0x18] = 0x80;
            auVar42[0x19] = 0x80;
            auVar42[0x1a] = 0x80;
            auVar42[0x1b] = 0x80;
            auVar42[0x1c] = 0x80;
            auVar42[0x1d] = 0x80;
            auVar42[0x1e] = 0x80;
            auVar42[0x1f] = 0x80;
            uVar18 = (uint)CONCAT71((uint7)(uint3)((uint)s2Len >> 8),0x80);
            uVar32 = 0;
            iVar36 = 0;
            auVar50 = ZEXT3264(auVar42);
            local_268 = auVar42;
            local_b8 = auVar42;
            do {
              local_278 = b;
              palVar61 = b_00;
              local_280 = b_01;
              palVar26 = b_02;
              auVar45 = SUB3216(local_278[uVar24],0);
              auVar52._0_16_ = ZEXT116(0) * auVar45 + ZEXT116(1) * auVar40;
              auVar41 = auVar42._16_16_;
              auVar52._16_16_ = ZEXT116(0) * auVar41 + ZEXT116(1) * auVar45;
              auVar52 = vpalignr_avx2((undefined1  [32])local_278[uVar24],auVar52,0xf);
              auVar45 = SUB3216(palVar61[uVar24],0);
              auVar48._0_16_ = ZEXT116(0) * auVar45 + ZEXT116(1) * auVar40;
              auVar48._16_16_ = ZEXT116(0) * auVar41 + ZEXT116(1) * auVar45;
              auVar48 = vpalignr_avx2((undefined1  [32])palVar61[uVar24],auVar48,0xf);
              auVar45 = SUB3216(local_280[uVar24],0);
              auVar57._0_16_ = ZEXT116(0) * auVar45 + ZEXT116(1) * auVar40;
              auVar57._16_16_ = ZEXT116(0) * auVar41 + ZEXT116(1) * auVar45;
              auVar57 = vpalignr_avx2((undefined1  [32])local_280[uVar24],auVar57,0xf);
              auVar45 = SUB3216(palVar26[uVar24],0);
              auVar58._0_16_ = ZEXT116(0) * auVar45 + ZEXT116(1) * auVar40;
              auVar58._16_16_ = ZEXT116(0) * auVar41 + ZEXT116(1) * auVar45;
              auVar58 = vpalignr_avx2((undefined1  [32])palVar26[uVar24],auVar58,0xf);
              auVar41 = vpinsrb_avx(auVar52._0_16_,0x80,0);
              auVar52 = vpblendd_avx2(auVar52,ZEXT1632(auVar41),0xf);
              auVar41 = vpinsrb_avx(auVar48._0_16_,0x80,0);
              auVar45 = vpinsrb_avx(auVar57._0_16_,0x80,0);
              auVar48 = vpblendd_avx2(auVar48,ZEXT1632(auVar41),0xf);
              auVar57 = vpblendd_avx2(auVar57,ZEXT1632(auVar45),0xf);
              auVar41 = vpinsrb_avx(auVar58._0_16_,0x80,0);
              lVar31 = size * (long)ppVar7->mapper[(byte)s2[uVar32]] * 0x20;
              local_208 = (int)uVar32;
              iVar25 = local_208 + -2;
              b_00 = palVar19;
              b_02 = palVar21;
              b_01 = palVar20;
              if (iVar36 == iVar25) {
                b_00 = local_290;
                b_02 = local_220;
                local_220 = palVar21;
                local_290 = palVar19;
                b_01 = local_2a8;
              }
              auVar58 = vpblendd_avx2(auVar58,ZEXT1632(auVar41),0xf);
              b = local_210;
              if (iVar36 == iVar25) {
                b = local_2a0;
              }
              lVar22 = 0;
              auVar60 = ZEXT3264(CONCAT131(0x81,CONCAT130(0x81,CONCAT129(0x81,CONCAT128(0x81,
                                                  CONCAT127(0x81,CONCAT126(0x81,CONCAT125(0x81,
                                                  CONCAT124(0x81,CONCAT123(0x81,CONCAT122(0x81,
                                                  CONCAT121(0x81,CONCAT120(0x81,CONCAT119(0x81,
                                                  CONCAT118(0x81,CONCAT117(0x81,CONCAT116(0x81,
                                                  CONCAT115(0x81,CONCAT114(0x81,CONCAT113(0x81,
                                                  CONCAT112(0x81,CONCAT111(0x81,CONCAT110(0x81,
                                                  CONCAT19(0x81,CONCAT18(0x81,0x8181818181818181))))
                                                  )))))))))))))))))))));
              auVar56 = ZEXT3264(auVar42);
              auVar54 = ZEXT3264(auVar42);
              auVar59 = ZEXT3264(auVar42);
              do {
                auVar1 = *(undefined1 (*) [32])((long)*b_03 + lVar22);
                auVar46 = *(undefined1 (*) [32])((long)*b_04 + lVar22);
                auVar47 = *(undefined1 (*) [32])((long)*b_05 + lVar22);
                auVar49 = *(undefined1 (*) [32])((long)*b_06 + lVar22);
                auVar52 = vpaddsb_avx2(auVar52,*(undefined1 (*) [32])
                                                ((long)pvVar6 + lVar22 + lVar31));
                auVar51 = vpmaxsb_avx2(auVar52,auVar1);
                auVar43 = auVar59._0_32_;
                auVar13 = vpmaxsb_avx2(auVar51,auVar43);
                *(undefined1 (*) [32])((long)*b + lVar22) = auVar13;
                auVar11 = vpcmpeqb_avx2(auVar13,auVar42);
                auVar53 = vpcmpeqb_avx2(auVar52,auVar13);
                auVar12 = vpcmpgtb_avx2(auVar51,auVar43);
                auVar51 = vpblendvb_avx2(auVar54._0_32_,auVar46,auVar12);
                auVar52 = vpaddsb_avx2(auVar48,*(undefined1 (*) [32])
                                                ((long)pvVar8 + lVar22 + lVar31));
                auVar52 = vpblendvb_avx2(auVar51,auVar52,auVar53);
                auVar51 = vpblendvb_avx2(auVar52,auVar42,auVar11);
                *(undefined1 (*) [32])((long)*b_00 + lVar22) = auVar51;
                auVar48 = vpblendvb_avx2(auVar56._0_32_,auVar47,auVar12);
                auVar52 = vpaddsb_avx2(auVar57,*(undefined1 (*) [32])
                                                ((long)pvVar9 + lVar22 + lVar31));
                auVar48 = vpblendvb_avx2(auVar48,auVar52,auVar53);
                auVar57 = vpblendvb_avx2(auVar60._0_32_,auVar49,auVar12);
                auVar15[8] = 1;
                auVar15._0_8_ = 0x101010101010101;
                auVar15[9] = 1;
                auVar15[10] = 1;
                auVar15[0xb] = 1;
                auVar15[0xc] = 1;
                auVar15[0xd] = 1;
                auVar15[0xe] = 1;
                auVar15[0xf] = 1;
                auVar15[0x10] = 1;
                auVar15[0x11] = 1;
                auVar15[0x12] = 1;
                auVar15[0x13] = 1;
                auVar15[0x14] = 1;
                auVar15[0x15] = 1;
                auVar15[0x16] = 1;
                auVar15[0x17] = 1;
                auVar15[0x18] = 1;
                auVar15[0x19] = 1;
                auVar15[0x1a] = 1;
                auVar15[0x1b] = 1;
                auVar15[0x1c] = 1;
                auVar15[0x1d] = 1;
                auVar15[0x1e] = 1;
                auVar15[0x1f] = 1;
                auVar52 = vpaddsb_avx2(auVar15,auVar58);
                auVar52 = vpblendvb_avx2(auVar57,auVar52,auVar53);
                auVar57 = vpblendvb_avx2(auVar48,auVar42,auVar11);
                *(undefined1 (*) [32])((long)*b_01 + lVar22) = auVar57;
                auVar48 = vpblendvb_avx2(auVar52,auVar42,auVar11);
                *(undefined1 (*) [32])((long)*b_02 + lVar22) = auVar48;
                auVar52 = vpmaxsb_avx2(auVar51,local_268);
                auVar58 = vpmaxsb_avx2(auVar57,auVar48);
                local_268 = vpmaxsb_avx2(auVar52,auVar58);
                auVar11[1] = uVar38;
                auVar11[0] = uVar38;
                auVar11[2] = uVar38;
                auVar11[3] = uVar38;
                auVar11[4] = uVar38;
                auVar11[5] = uVar38;
                auVar11[6] = uVar38;
                auVar11[7] = uVar38;
                auVar11[8] = uVar38;
                auVar11[9] = uVar38;
                auVar11[10] = uVar38;
                auVar11[0xb] = uVar38;
                auVar11[0xc] = uVar38;
                auVar11[0xd] = uVar38;
                auVar11[0xe] = uVar38;
                auVar11[0xf] = uVar38;
                auVar11[0x10] = uVar38;
                auVar11[0x11] = uVar38;
                auVar11[0x12] = uVar38;
                auVar11[0x13] = uVar38;
                auVar11[0x14] = uVar38;
                auVar11[0x15] = uVar38;
                auVar11[0x16] = uVar38;
                auVar11[0x17] = uVar38;
                auVar11[0x18] = uVar38;
                auVar11[0x19] = uVar38;
                auVar11[0x1a] = uVar38;
                auVar11[0x1b] = uVar38;
                auVar11[0x1c] = uVar38;
                auVar11[0x1d] = uVar38;
                auVar11[0x1e] = uVar38;
                auVar11[0x1f] = uVar38;
                auVar53 = vpsubsb_avx2(auVar13,auVar11);
                auVar14[1] = uVar39;
                auVar14[0] = uVar39;
                auVar14[2] = uVar39;
                auVar14[3] = uVar39;
                auVar14[4] = uVar39;
                auVar14[5] = uVar39;
                auVar14[6] = uVar39;
                auVar14[7] = uVar39;
                auVar14[8] = uVar39;
                auVar14[9] = uVar39;
                auVar14[10] = uVar39;
                auVar14[0xb] = uVar39;
                auVar14[0xc] = uVar39;
                auVar14[0xd] = uVar39;
                auVar14[0xe] = uVar39;
                auVar14[0xf] = uVar39;
                auVar14[0x10] = uVar39;
                auVar14[0x11] = uVar39;
                auVar14[0x12] = uVar39;
                auVar14[0x13] = uVar39;
                auVar14[0x14] = uVar39;
                auVar14[0x15] = uVar39;
                auVar14[0x16] = uVar39;
                auVar14[0x17] = uVar39;
                auVar14[0x18] = uVar39;
                auVar14[0x19] = uVar39;
                auVar14[0x1a] = uVar39;
                auVar14[0x1b] = uVar39;
                auVar14[0x1c] = uVar39;
                auVar14[0x1d] = uVar39;
                auVar14[0x1e] = uVar39;
                auVar14[0x1f] = uVar39;
                auVar12 = vpsubsb_avx2(auVar1,auVar14);
                auVar11 = vpcmpgtb_avx2(auVar53,auVar12);
                auVar58 = vpblendvb_avx2(auVar46,auVar51,auVar11);
                auVar52 = vpmaxsb_avx2(auVar13,auVar50._0_32_);
                auVar50 = ZEXT3264(auVar52);
                auVar1 = vpblendvb_avx2(auVar47,auVar57,auVar11);
                auVar52 = vpaddsb_avx2(auVar49,auVar15);
                auVar48 = vpaddsb_avx2(auVar48,auVar15);
                auVar52 = vpblendvb_avx2(auVar52,auVar48,auVar11);
                auVar46 = vpmaxsb_avx2(auVar53,auVar12);
                *(undefined1 (*) [32])((long)*b_03 + lVar22) = auVar46;
                *(undefined1 (*) [32])((long)*b_04 + lVar22) = auVar58;
                *(undefined1 (*) [32])((long)*b_05 + lVar22) = auVar1;
                *(undefined1 (*) [32])((long)*b_06 + lVar22) = auVar52;
                auVar1 = vpsubsb_avx2(auVar43,auVar14);
                auVar58 = vpcmpgtb_avx2(auVar53,auVar1);
                auVar52 = vpblendvb_avx2(auVar54._0_32_,auVar51,auVar58);
                auVar54 = ZEXT3264(auVar52);
                auVar52 = vpmaxsb_avx2(auVar53,auVar1);
                auVar59 = ZEXT3264(auVar52);
                auVar52 = vpblendvb_avx2(auVar56._0_32_,auVar57,auVar58);
                auVar56 = ZEXT3264(auVar52);
                auVar52 = vpaddsb_avx2(auVar15,auVar60._0_32_);
                auVar52 = vpblendvb_avx2(auVar52,auVar48,auVar58);
                auVar60 = ZEXT3264(auVar52);
                auVar52 = *(undefined1 (*) [32])((long)*local_278 + lVar22);
                auVar48 = *(undefined1 (*) [32])((long)*palVar61 + lVar22);
                auVar57 = *(undefined1 (*) [32])((long)*local_280 + lVar22);
                auVar58 = *(undefined1 (*) [32])((long)*palVar26 + lVar22);
                lVar22 = lVar22 + 0x20;
              } while (size << 5 != lVar22);
              if (iVar36 == iVar25) {
                local_2a0 = local_210;
                local_2a8 = palVar20;
              }
              iVar25 = 0;
              auVar1[1] = uVar38;
              auVar1[0] = uVar38;
              auVar1[2] = uVar38;
              auVar1[3] = uVar38;
              auVar1[4] = uVar38;
              auVar1[5] = uVar38;
              auVar1[6] = uVar38;
              auVar1[7] = uVar38;
              auVar1[8] = uVar38;
              auVar1[9] = uVar38;
              auVar1[10] = uVar38;
              auVar1[0xb] = uVar38;
              auVar1[0xc] = uVar38;
              auVar1[0xd] = uVar38;
              auVar1[0xe] = uVar38;
              auVar1[0xf] = uVar38;
              auVar1[0x10] = uVar38;
              auVar1[0x11] = uVar38;
              auVar1[0x12] = uVar38;
              auVar1[0x13] = uVar38;
              auVar1[0x14] = uVar38;
              auVar1[0x15] = uVar38;
              auVar1[0x16] = uVar38;
              auVar1[0x17] = uVar38;
              auVar1[0x18] = uVar38;
              auVar1[0x19] = uVar38;
              auVar1[0x1a] = uVar38;
              auVar1[0x1b] = uVar38;
              auVar1[0x1c] = uVar38;
              auVar1[0x1d] = uVar38;
              auVar1[0x1e] = uVar38;
              auVar1[0x1f] = uVar38;
              do {
                alVar2 = local_278[uVar24];
                auVar41 = alVar2._0_16_;
                auVar46._0_16_ = ZEXT116(0) * auVar41 + ZEXT116(1) * auVar41;
                auVar46._16_16_ = ZEXT116(0) * alVar2._16_16_ + ZEXT116(1) * auVar41;
                auVar52 = vpalignr_avx2((undefined1  [32])alVar2,auVar46,0xf);
                auVar41 = auVar52._0_16_;
                auVar47._0_16_ = ZEXT116(0) * auVar59._0_16_ + ZEXT116(1) * auVar41;
                auVar45 = auVar52._16_16_;
                auVar47._16_16_ = ZEXT116(0) * auVar45 + ZEXT116(1) * auVar59._0_16_;
                auVar48 = vpalignr_avx2(auVar59._0_32_,auVar47,0xf);
                auVar49._0_16_ = ZEXT116(0) * auVar54._0_16_ + ZEXT116(1) * auVar41;
                auVar49._16_16_ = ZEXT116(0) * auVar45 + ZEXT116(1) * auVar54._0_16_;
                auVar57 = vpalignr_avx2(auVar54._0_32_,auVar49,0xf);
                auVar51._0_16_ = ZEXT116(0) * auVar56._0_16_ + ZEXT116(1) * auVar41;
                auVar51._16_16_ = ZEXT116(0) * auVar45 + ZEXT116(1) * auVar56._0_16_;
                auVar58 = vpalignr_avx2(auVar56._0_32_,auVar51,0xf);
                auVar53._0_16_ = ZEXT116(0) * auVar60._0_16_ + ZEXT116(1) * auVar41;
                auVar53._16_16_ = ZEXT116(0) * auVar45 + ZEXT116(1) * auVar60._0_16_;
                auVar46 = vpalignr_avx2(auVar60._0_32_,auVar53,0xf);
                auVar41 = vpinsrb_avx(auVar41,0x80,0);
                auVar45 = vpinsrb_avx(auVar48._0_16_,0x80,0);
                auVar52 = vpblendd_avx2(auVar52,ZEXT1632(auVar41),0xf);
                auVar48 = vpblendd_avx2(auVar48,ZEXT1632(auVar45),0xf);
                auVar59 = ZEXT3264(auVar48);
                auVar41 = vpinsrb_avx(auVar57._0_16_,0x80,0);
                auVar48 = vpblendd_avx2(auVar57,ZEXT1632(auVar41),0xf);
                auVar54 = ZEXT3264(auVar48);
                auVar41 = vpinsrb_avx(auVar58._0_16_,0x80,0);
                auVar48 = vpblendd_avx2(auVar58,ZEXT1632(auVar41),0xf);
                auVar56 = ZEXT3264(auVar48);
                auVar41 = vpinsrb_avx(auVar46._0_16_,0x81,0);
                auVar48 = vpblendd_avx2(auVar46,ZEXT1632(auVar41),0xf);
                auVar60 = ZEXT3264(auVar48);
                lVar22 = 0;
                do {
                  auVar12[1] = uVar39;
                  auVar12[0] = uVar39;
                  auVar12[2] = uVar39;
                  auVar12[3] = uVar39;
                  auVar12[4] = uVar39;
                  auVar12[5] = uVar39;
                  auVar12[6] = uVar39;
                  auVar12[7] = uVar39;
                  auVar12[8] = uVar39;
                  auVar12[9] = uVar39;
                  auVar12[10] = uVar39;
                  auVar12[0xb] = uVar39;
                  auVar12[0xc] = uVar39;
                  auVar12[0xd] = uVar39;
                  auVar12[0xe] = uVar39;
                  auVar12[0xf] = uVar39;
                  auVar12[0x10] = uVar39;
                  auVar12[0x11] = uVar39;
                  auVar12[0x12] = uVar39;
                  auVar12[0x13] = uVar39;
                  auVar12[0x14] = uVar39;
                  auVar12[0x15] = uVar39;
                  auVar12[0x16] = uVar39;
                  auVar12[0x17] = uVar39;
                  auVar12[0x18] = uVar39;
                  auVar12[0x19] = uVar39;
                  auVar12[0x1a] = uVar39;
                  auVar12[0x1b] = uVar39;
                  auVar12[0x1c] = uVar39;
                  auVar12[0x1d] = uVar39;
                  auVar12[0x1e] = uVar39;
                  auVar12[0x1f] = uVar39;
                  auVar52 = vpaddsb_avx2(auVar52,*(undefined1 (*) [32])
                                                  ((long)pvVar6 + lVar22 + lVar31));
                  auVar48 = *(undefined1 (*) [32])((long)*b + lVar22);
                  auVar46 = auVar59._0_32_;
                  auVar47 = vpmaxsb_avx2(auVar48,auVar46);
                  *(undefined1 (*) [32])((long)*b + lVar22) = auVar47;
                  auVar57 = vpcmpeqb_avx2(auVar47,auVar52);
                  auVar48 = vpcmpgtb_avx2(auVar48,auVar46);
                  auVar49 = vpor_avx2(auVar57,auVar48);
                  auVar57 = vpblendvb_avx2(auVar54._0_32_,
                                           *(undefined1 (*) [32])((long)*b_00 + lVar22),auVar49);
                  *(undefined1 (*) [32])((long)*b_00 + lVar22) = auVar57;
                  auVar58 = vpblendvb_avx2(auVar56._0_32_,
                                           *(undefined1 (*) [32])((long)*b_01 + lVar22),auVar49);
                  *(undefined1 (*) [32])((long)*b_01 + lVar22) = auVar58;
                  auVar51 = vpsubsb_avx2(auVar47,auVar1);
                  auVar11 = vpsubsb_avx2(auVar46,auVar12);
                  auVar48 = vpcmpeqb_avx2(auVar51,auVar11);
                  auVar46 = vpcmpgtb_avx2(auVar11,auVar42);
                  auVar48 = vpand_avx2(auVar48,auVar46);
                  auVar46 = vpcmpgtb_avx2(auVar11,auVar51);
                  auVar46 = vpor_avx2(auVar48,auVar46);
                  auVar48 = vpblendvb_avx2(auVar60._0_32_,
                                           *(undefined1 (*) [32])((long)*b_02 + lVar22),auVar49);
                  cVar23 = SUB321(auVar46 >> 0x7f,0);
                  cVar30 = SUB321(auVar46 >> 0xbf,0);
                  *(undefined1 (*) [32])((long)*b_02 + lVar22) = auVar48;
                  if ((((((((((((((((((((((((((((((((auVar46 >> 7 & (undefined1  [32])0x1) ==
                                                    (undefined1  [32])0x0 &&
                                                   (auVar46 >> 0xf & (undefined1  [32])0x1) ==
                                                   (undefined1  [32])0x0) &&
                                                  (auVar46 >> 0x17 & (undefined1  [32])0x1) ==
                                                  (undefined1  [32])0x0) &&
                                                 (auVar46 >> 0x1f & (undefined1  [32])0x1) ==
                                                 (undefined1  [32])0x0) &&
                                                (auVar46 >> 0x27 & (undefined1  [32])0x1) ==
                                                (undefined1  [32])0x0) &&
                                               (auVar46 >> 0x2f & (undefined1  [32])0x1) ==
                                               (undefined1  [32])0x0) &&
                                              (auVar46 >> 0x37 & (undefined1  [32])0x1) ==
                                              (undefined1  [32])0x0) &&
                                             (auVar46 >> 0x3f & (undefined1  [32])0x1) ==
                                             (undefined1  [32])0x0) &&
                                            (auVar46 >> 0x47 & (undefined1  [32])0x1) ==
                                            (undefined1  [32])0x0) &&
                                           (auVar46 >> 0x4f & (undefined1  [32])0x1) ==
                                           (undefined1  [32])0x0) &&
                                          (auVar46 >> 0x57 & (undefined1  [32])0x1) ==
                                          (undefined1  [32])0x0) &&
                                         (auVar46 >> 0x5f & (undefined1  [32])0x1) ==
                                         (undefined1  [32])0x0) &&
                                        (auVar46 >> 0x67 & (undefined1  [32])0x1) ==
                                        (undefined1  [32])0x0) &&
                                       (auVar46 >> 0x6f & (undefined1  [32])0x1) ==
                                       (undefined1  [32])0x0) &&
                                      (auVar46 >> 0x77 & (undefined1  [32])0x1) ==
                                      (undefined1  [32])0x0) && cVar23 == '\0') &&
                                    (auVar46 >> 0x87 & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) &&
                                   (auVar46 >> 0x8f & (undefined1  [32])0x1) ==
                                   (undefined1  [32])0x0) &&
                                  (auVar46 >> 0x97 & (undefined1  [32])0x1) == (undefined1  [32])0x0
                                  ) && (auVar46 >> 0x9f & (undefined1  [32])0x1) ==
                                       (undefined1  [32])0x0) &&
                                (auVar46 >> 0xa7 & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                               && (auVar46 >> 0xaf & (undefined1  [32])0x1) == (undefined1  [32])0x0
                               ) && (auVar46 >> 0xb7 & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) && cVar30 == '\0') &&
                            (auVar46 >> 199 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                           (auVar46 >> 0xcf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (auVar46 >> 0xd7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         (auVar46 >> 0xdf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar46 >> 0xe7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       (auVar46 >> 0xef & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar46 >> 0xf7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      -1 < auVar46[0x1f]) {
                    iVar29 = 0x1e;
                  }
                  else {
                    auVar51 = vpcmpgtb_avx2(auVar51,auVar11);
                    auVar52 = vpblendvb_avx2(auVar54._0_32_,auVar57,auVar51);
                    auVar54 = ZEXT3264(auVar52);
                    auVar52 = vpblendvb_avx2(auVar56._0_32_,auVar58,auVar51);
                    auVar56 = ZEXT3264(auVar52);
                    auVar13[8] = 1;
                    auVar13._0_8_ = 0x101010101010101;
                    auVar13[9] = 1;
                    auVar13[10] = 1;
                    auVar13[0xb] = 1;
                    auVar13[0xc] = 1;
                    auVar13[0xd] = 1;
                    auVar13[0xe] = 1;
                    auVar13[0xf] = 1;
                    auVar13[0x10] = 1;
                    auVar13[0x11] = 1;
                    auVar13[0x12] = 1;
                    auVar13[0x13] = 1;
                    auVar13[0x14] = 1;
                    auVar13[0x15] = 1;
                    auVar13[0x16] = 1;
                    auVar13[0x17] = 1;
                    auVar13[0x18] = 1;
                    auVar13[0x19] = 1;
                    auVar13[0x1a] = 1;
                    auVar13[0x1b] = 1;
                    auVar13[0x1c] = 1;
                    auVar13[0x1d] = 1;
                    auVar13[0x1e] = 1;
                    auVar13[0x1f] = 1;
                    auVar52 = vpaddsb_avx2(auVar60._0_32_,auVar13);
                    auVar49 = vpaddsb_avx2(auVar48,auVar13);
                    auVar52 = vpblendvb_avx2(auVar52,auVar49,auVar51);
                    auVar60 = ZEXT3264(auVar52);
                    auVar52 = *(undefined1 (*) [32])((long)*local_278 + lVar22);
                    iVar29 = 0;
                    auVar59 = ZEXT3264(auVar11);
                  }
                  auVar57 = vpmaxsb_avx2(auVar57,local_268);
                  auVar48 = vpmaxsb_avx2(auVar58,auVar48);
                  local_268 = vpmaxsb_avx2(auVar57,auVar48);
                  auVar48 = vpmaxsb_avx2(auVar47,auVar50._0_32_);
                  auVar50 = ZEXT3264(auVar48);
                  if ((((((((((((((((((((((((((((((((auVar46 >> 7 & (undefined1  [32])0x1) ==
                                                    (undefined1  [32])0x0 &&
                                                   (auVar46 >> 0xf & (undefined1  [32])0x1) ==
                                                   (undefined1  [32])0x0) &&
                                                  (auVar46 >> 0x17 & (undefined1  [32])0x1) ==
                                                  (undefined1  [32])0x0) &&
                                                 (auVar46 >> 0x1f & (undefined1  [32])0x1) ==
                                                 (undefined1  [32])0x0) &&
                                                (auVar46 >> 0x27 & (undefined1  [32])0x1) ==
                                                (undefined1  [32])0x0) &&
                                               (auVar46 >> 0x2f & (undefined1  [32])0x1) ==
                                               (undefined1  [32])0x0) &&
                                              (auVar46 >> 0x37 & (undefined1  [32])0x1) ==
                                              (undefined1  [32])0x0) &&
                                             (auVar46 >> 0x3f & (undefined1  [32])0x1) ==
                                             (undefined1  [32])0x0) &&
                                            (auVar46 >> 0x47 & (undefined1  [32])0x1) ==
                                            (undefined1  [32])0x0) &&
                                           (auVar46 >> 0x4f & (undefined1  [32])0x1) ==
                                           (undefined1  [32])0x0) &&
                                          (auVar46 >> 0x57 & (undefined1  [32])0x1) ==
                                          (undefined1  [32])0x0) &&
                                         (auVar46 >> 0x5f & (undefined1  [32])0x1) ==
                                         (undefined1  [32])0x0) &&
                                        (auVar46 >> 0x67 & (undefined1  [32])0x1) ==
                                        (undefined1  [32])0x0) &&
                                       (auVar46 >> 0x6f & (undefined1  [32])0x1) ==
                                       (undefined1  [32])0x0) &&
                                      (auVar46 >> 0x77 & (undefined1  [32])0x1) ==
                                      (undefined1  [32])0x0) && cVar23 == '\0') &&
                                    (auVar46 >> 0x87 & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) &&
                                   (auVar46 >> 0x8f & (undefined1  [32])0x1) ==
                                   (undefined1  [32])0x0) &&
                                  (auVar46 >> 0x97 & (undefined1  [32])0x1) == (undefined1  [32])0x0
                                  ) && (auVar46 >> 0x9f & (undefined1  [32])0x1) ==
                                       (undefined1  [32])0x0) &&
                                (auVar46 >> 0xa7 & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                               && (auVar46 >> 0xaf & (undefined1  [32])0x1) == (undefined1  [32])0x0
                               ) && (auVar46 >> 0xb7 & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) && cVar30 == '\0') &&
                            (auVar46 >> 199 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                           (auVar46 >> 0xcf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (auVar46 >> 0xd7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         (auVar46 >> 0xdf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar46 >> 0xe7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       (auVar46 >> 0xef & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar46 >> 0xf7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      -1 < auVar46[0x1f]) goto LAB_00829164;
                  lVar22 = lVar22 + 0x20;
                } while (size << 5 != lVar22);
                iVar29 = 0;
LAB_00829164:
                if (iVar29 != 0) {
                  if (iVar29 != 0x1e) {
                    bVar10 = false;
                    goto LAB_0082935d;
                  }
                  break;
                }
                iVar25 = iVar25 + 1;
              } while (iVar25 != 0x20);
              alVar2 = b[uVar35];
              cVar23 = alVar2[2]._7_1_;
              alVar3 = b_00[uVar35];
              cVar30 = alVar3[2]._7_1_;
              alVar4 = b_01[uVar35];
              cVar28 = alVar4[2]._7_1_;
              alVar5 = b_02[uVar35];
              cVar55 = alVar5[2]._7_1_;
              iVar25 = iVar37;
              if (iVar17 < 0x1f) {
                do {
                  auVar52 = vperm2i128_avx2((undefined1  [32])alVar2,(undefined1  [32])alVar2,0x28);
                  alVar2 = (__m256i)vpalignr_avx2((undefined1  [32])alVar2,auVar52,0xf);
                  cVar23 = alVar2[2]._7_1_;
                  auVar52 = vperm2i128_avx2((undefined1  [32])alVar3,(undefined1  [32])alVar3,0x28);
                  alVar3 = (__m256i)vpalignr_avx2((undefined1  [32])alVar3,auVar52,0xf);
                  cVar30 = alVar3[2]._7_1_;
                  auVar52 = vperm2i128_avx2((undefined1  [32])alVar4,(undefined1  [32])alVar4,0x28);
                  alVar4 = (__m256i)vpalignr_avx2((undefined1  [32])alVar4,auVar52,0xf);
                  cVar28 = alVar4[2]._7_1_;
                  auVar52 = vperm2i128_avx2((undefined1  [32])alVar5,(undefined1  [32])alVar5,0x28);
                  alVar5 = (__m256i)vpalignr_avx2((undefined1  [32])alVar5,auVar52,0xf);
                  cVar55 = alVar5[2]._7_1_;
                  iVar25 = iVar25 + -1;
                } while (iVar25 != 0);
              }
              *(int *)(*((result->field_4).trace)->trace_del_table + uVar32 * 4) = cVar23 + 0x80;
              *(int *)(*(long *)((long)((result->field_4).trace)->trace_del_table + 8) + uVar32 * 4)
                   = cVar30 + 0x80;
              *(int *)(*(long *)((long)((result->field_4).trace)->trace_del_table + 0x10) +
                      uVar32 * 4) = cVar28 + 0x80;
              *(int *)(*(long *)((long)((result->field_4).trace)->trace_del_table + 0x18) +
                      uVar32 * 4) = cVar55 + 0x80;
              auVar52 = vpcmpgtb_avx2(auVar48,local_b8);
              bVar10 = true;
              if ((((((((((((((((((((((((((((((((auVar52 >> 7 & (undefined1  [32])0x1) !=
                                                (undefined1  [32])0x0 ||
                                               (auVar52 >> 0xf & (undefined1  [32])0x1) !=
                                               (undefined1  [32])0x0) ||
                                              (auVar52 >> 0x17 & (undefined1  [32])0x1) !=
                                              (undefined1  [32])0x0) ||
                                             (auVar52 >> 0x1f & (undefined1  [32])0x1) !=
                                             (undefined1  [32])0x0) ||
                                            (auVar52 >> 0x27 & (undefined1  [32])0x1) !=
                                            (undefined1  [32])0x0) ||
                                           (auVar52 >> 0x2f & (undefined1  [32])0x1) !=
                                           (undefined1  [32])0x0) ||
                                          (auVar52 >> 0x37 & (undefined1  [32])0x1) !=
                                          (undefined1  [32])0x0) ||
                                         (auVar52 >> 0x3f & (undefined1  [32])0x1) !=
                                         (undefined1  [32])0x0) ||
                                        (auVar52 >> 0x47 & (undefined1  [32])0x1) !=
                                        (undefined1  [32])0x0) ||
                                       (auVar52 >> 0x4f & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                      (auVar52 >> 0x57 & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) ||
                                     (auVar52 >> 0x5f & (undefined1  [32])0x1) !=
                                     (undefined1  [32])0x0) ||
                                    (auVar52 >> 0x67 & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) ||
                                   (auVar52 >> 0x6f & (undefined1  [32])0x1) !=
                                   (undefined1  [32])0x0) ||
                                  (auVar52 >> 0x77 & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                  ) || SUB321(auVar52 >> 0x7f,0) != '\0') ||
                                (auVar52 >> 0x87 & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                               || (auVar52 >> 0x8f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               ) || (auVar52 >> 0x97 & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) ||
                             (auVar52 >> 0x9f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar52 >> 0xa7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           (auVar52 >> 0xaf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar52 >> 0xb7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar52 >> 0xbf,0) != '\0') ||
                        (auVar52 >> 199 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       (auVar52 >> 0xcf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar52 >> 0xd7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     (auVar52 >> 0xdf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar52 >> 0xe7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   (auVar52 >> 0xef & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar52 >> 0xf7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  auVar52[0x1f] < '\0') {
                auVar52 = vpermq_avx2(auVar48,0x44);
                auVar52 = vpmaxsb_avx2(auVar48,auVar52);
                auVar48 = vpslldq_avx2(auVar52,8);
                auVar52 = vpmaxsb_avx2(auVar52,auVar48);
                auVar48 = vpslldq_avx2(auVar52,4);
                auVar52 = vpmaxsb_avx2(auVar52,auVar48);
                auVar48 = vpslldq_avx2(auVar52,2);
                auVar52 = vpmaxsb_avx2(auVar52,auVar48);
                auVar48 = vpslldq_avx2(auVar52,1);
                auVar52 = vpmaxsb_avx2(auVar52,auVar48);
                uVar18 = (uint)auVar52[0x17];
                bVar10 = (char)auVar52[0x17] <= (char)('~' - local_1e8);
                if (bVar10) {
                  auVar43[8] = 0xf;
                  auVar43._0_8_ = 0xf0f0f0f0f0f0f0f;
                  auVar43[9] = 0xf;
                  auVar43[10] = 0xf;
                  auVar43[0xb] = 0xf;
                  auVar43[0xc] = 0xf;
                  auVar43[0xd] = 0xf;
                  auVar43[0xe] = 0xf;
                  auVar43[0xf] = 0xf;
                  auVar43[0x10] = 0xf;
                  auVar43[0x11] = 0xf;
                  auVar43[0x12] = 0xf;
                  auVar43[0x13] = 0xf;
                  auVar43[0x14] = 0xf;
                  auVar43[0x15] = 0xf;
                  auVar43[0x16] = 0xf;
                  auVar43[0x17] = 0xf;
                  auVar43[0x18] = 0xf;
                  auVar43[0x19] = 0xf;
                  auVar43[0x1a] = 0xf;
                  auVar43[0x1b] = 0xf;
                  auVar43[0x1c] = 0xf;
                  auVar43[0x1d] = 0xf;
                  auVar43[0x1e] = 0xf;
                  auVar43[0x1f] = 0xf;
                  auVar52 = vpshufb_avx2(auVar52,auVar43);
                  local_b8 = vpermq_avx2(auVar52,0xaa);
                  iVar36 = local_208;
                }
                else {
                  *(byte *)&result->flag = (byte)result->flag | 0x40;
                }
              }
LAB_0082935d:
              if ((!bVar10) ||
                 (uVar32 = uVar32 + 1, palVar21 = palVar26, palVar20 = local_280,
                 palVar19 = palVar61, local_210 = local_278, local_208 = s2Len,
                 uVar32 == (uint)s2Len)) {
                lVar31 = 0;
                iVar37 = 0;
                palVar21 = palVar26;
                do {
                  vH[0]._4_4_ = iVar36;
                  vH[0]._0_4_ = in_stack_fffffffffffffd38;
                  vH[1] = (longlong)palVar21;
                  vH[2] = (longlong)palVar61;
                  vH[3]._0_4_ = in_stack_fffffffffffffd50;
                  vH[3]._4_4_ = uVar18;
                  arr_store_col(*(int **)((long)((result->field_4).trace)->trace_del_table + 0x20),
                                vH,iVar37,seglen,(int32_t)palVar26);
                  vH_00[0]._4_4_ = iVar36;
                  vH_00[0]._0_4_ = in_stack_fffffffffffffd38;
                  vH_00[1] = (longlong)palVar21;
                  vH_00[2] = (longlong)palVar61;
                  vH_00[3]._0_4_ = in_stack_fffffffffffffd50;
                  vH_00[3]._4_4_ = uVar18;
                  arr_store_col(*(int **)((long)((result->field_4).trace)->trace_del_table + 0x28),
                                vH_00,iVar37,seglen,(int32_t)palVar26);
                  vH_01[0]._4_4_ = iVar36;
                  vH_01[0]._0_4_ = in_stack_fffffffffffffd38;
                  vH_01[1] = (longlong)palVar21;
                  vH_01[2] = (longlong)palVar61;
                  vH_01[3]._0_4_ = in_stack_fffffffffffffd50;
                  vH_01[3]._4_4_ = uVar18;
                  arr_store_col(*(int **)((long)((result->field_4).trace)->trace_del_table + 0x30),
                                vH_01,iVar37,seglen,(int32_t)palVar26);
                  vH_02[0]._4_4_ = iVar36;
                  vH_02[0]._0_4_ = in_stack_fffffffffffffd38;
                  vH_02[1] = (longlong)palVar21;
                  vH_02[2] = (longlong)palVar61;
                  vH_02[3]._0_4_ = in_stack_fffffffffffffd50;
                  vH_02[3]._4_4_ = uVar18;
                  arr_store_col(*(int **)((long)((result->field_4).trace)->trace_del_table + 0x38),
                                vH_02,iVar37,seglen,(int32_t)palVar26);
                  iVar37 = iVar37 + 1;
                  lVar31 = lVar31 + 0x20;
                } while ((ulong)(seglen + (seglen == 0)) << 5 != lVar31);
                if (((char)uVar18 == '\x7f') ||
                   (auVar44[8] = 0x7f, auVar44._0_8_ = 0x7f7f7f7f7f7f7f7f, auVar44[9] = 0x7f,
                   auVar44[10] = 0x7f, auVar44[0xb] = 0x7f, auVar44[0xc] = 0x7f, auVar44[0xd] = 0x7f
                   , auVar44[0xe] = 0x7f, auVar44[0xf] = 0x7f, auVar44[0x10] = 0x7f,
                   auVar44[0x11] = 0x7f, auVar44[0x12] = 0x7f, auVar44[0x13] = 0x7f,
                   auVar44[0x14] = 0x7f, auVar44[0x15] = 0x7f, auVar44[0x16] = 0x7f,
                   auVar44[0x17] = 0x7f, auVar44[0x18] = 0x7f, auVar44[0x19] = 0x7f,
                   auVar44[0x1a] = 0x7f, auVar44[0x1b] = 0x7f, auVar44[0x1c] = 0x7f,
                   auVar44[0x1d] = 0x7f, auVar44[0x1e] = 0x7f, auVar44[0x1f] = 0x7f,
                   auVar42 = vpcmpeqb_avx2(auVar44,local_268),
                   (((((((((((((((((((((((((((((((auVar42 >> 7 & (undefined1  [32])0x1) !=
                                                 (undefined1  [32])0x0 ||
                                                (auVar42 >> 0xf & (undefined1  [32])0x1) !=
                                                (undefined1  [32])0x0) ||
                                               (auVar42 >> 0x17 & (undefined1  [32])0x1) !=
                                               (undefined1  [32])0x0) ||
                                              (auVar42 >> 0x1f & (undefined1  [32])0x1) !=
                                              (undefined1  [32])0x0) ||
                                             (auVar42 >> 0x27 & (undefined1  [32])0x1) !=
                                             (undefined1  [32])0x0) ||
                                            (auVar42 >> 0x2f & (undefined1  [32])0x1) !=
                                            (undefined1  [32])0x0) ||
                                           (auVar42 >> 0x37 & (undefined1  [32])0x1) !=
                                           (undefined1  [32])0x0) ||
                                          (auVar42 >> 0x3f & (undefined1  [32])0x1) !=
                                          (undefined1  [32])0x0) ||
                                         (auVar42 >> 0x47 & (undefined1  [32])0x1) !=
                                         (undefined1  [32])0x0) ||
                                        (auVar42 >> 0x4f & (undefined1  [32])0x1) !=
                                        (undefined1  [32])0x0) ||
                                       (auVar42 >> 0x57 & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                      (auVar42 >> 0x5f & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) ||
                                     (auVar42 >> 0x67 & (undefined1  [32])0x1) !=
                                     (undefined1  [32])0x0) ||
                                    (auVar42 >> 0x6f & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) ||
                                   (auVar42 >> 0x77 & (undefined1  [32])0x1) !=
                                   (undefined1  [32])0x0) || SUB321(auVar42 >> 0x7f,0) != '\0') ||
                                 (auVar42 >> 0x87 & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                                || (auVar42 >> 0x8f & (undefined1  [32])0x1) !=
                                   (undefined1  [32])0x0) ||
                               (auVar42 >> 0x97 & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                              || (auVar42 >> 0x9f & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                             || (auVar42 >> 0xa7 & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                            || (auVar42 >> 0xaf & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                           || (auVar42 >> 0xb7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          SUB321(auVar42 >> 0xbf,0) != '\0') ||
                         (auVar42 >> 199 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar42 >> 0xcf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       (auVar42 >> 0xd7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar42 >> 0xdf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     (auVar42 >> 0xe7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar42 >> 0xef & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   (auVar42 >> 0xf7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   auVar42[0x1f] < '\0')) {
                  *(byte *)&result->flag = (byte)result->flag | 0x40;
                }
                iVar37 = parasail_result_is_saturated(result);
                palVar20 = palVar61;
                if (iVar37 == 0) {
                  palVar19 = b_00;
                  ptr = b_01;
                  ptr_00 = local_220;
                  palVar26 = b;
                  palVar16 = b_02;
                  ptr_01 = local_2a8;
                  ptr_02 = local_290;
                  ptr_03 = local_2a0;
                  if ((iVar36 != local_208 + -1) &&
                     (palVar19 = local_290, ptr = local_2a8, ptr_00 = b_02, palVar26 = local_2a0,
                     palVar16 = local_220, ptr_01 = b_01, ptr_02 = b_00, ptr_03 = b,
                     iVar36 == local_208 + -2)) {
                    palVar20 = local_290;
                    palVar19 = palVar61;
                    ptr = local_280;
                    palVar26 = local_278;
                    local_278 = local_2a0;
                    palVar16 = palVar21;
                    palVar21 = local_220;
                    local_280 = local_2a8;
                  }
                  local_220 = palVar16;
                  if ((uVar27 & 0x7fffffe0) == 0) {
                    iVar37 = 0;
                    iVar17 = 0;
                    iVar25 = 0;
                  }
                  else {
                    cVar23 = -0x80;
                    uVar27 = 0;
                    cVar30 = -0x80;
                    cVar28 = -0x80;
                    do {
                      if ((*(char *)((long)*palVar26 + uVar27) == (char)uVar18) &&
                         (uVar33 = ((uint)uVar27 & 0x1f) * seglen +
                                   ((uint)(uVar27 >> 5) & 0x7ffffff), (int)uVar33 < (int)uVar34)) {
                        cVar23 = *(char *)((long)*palVar19 + uVar27);
                        cVar30 = *(char *)((long)*ptr + uVar27);
                        cVar28 = *(char *)((long)*local_220 + uVar27);
                        uVar34 = (ulong)uVar33;
                      }
                      uVar33 = (uint)uVar34;
                      uVar27 = uVar27 + 1;
                    } while ((seglen & 0x3ffffff) << 5 != (int)uVar27);
                    iVar25 = cVar23 + 0x80;
                    iVar17 = cVar30 + 0x80;
                    iVar37 = cVar28 + 0x80;
                  }
                  iVar29 = (char)uVar18 + 0x80;
                }
                else {
                  iVar36 = 0;
                  iVar37 = 0x80;
                  iVar17 = 0x80;
                  iVar25 = 0x80;
                  iVar29 = 0x80;
                  uVar33 = 0;
                  ptr_00 = b_02;
                  ptr_01 = b_01;
                  ptr = local_2a8;
                  ptr_02 = b_00;
                  ptr_03 = b;
                  palVar19 = local_290;
                  palVar26 = local_2a0;
                }
                result->score = iVar29;
                result->end_query = uVar33;
                result->end_ref = iVar36;
                ((result->field_4).stats)->matches = iVar25;
                ((result->field_4).stats)->similar = iVar17;
                ((result->field_4).stats)->length = iVar37;
                parasail_free(local_220);
                parasail_free(ptr);
                parasail_free(palVar19);
                parasail_free(palVar26);
                parasail_free(b_06);
                parasail_free(b_05);
                parasail_free(b_04);
                parasail_free(b_03);
                parasail_free(palVar21);
                parasail_free(ptr_00);
                parasail_free(local_280);
                parasail_free(ptr_01);
                parasail_free(palVar20);
                parasail_free(ptr_02);
                parasail_free(local_278);
                parasail_free(ptr_03);
                return result;
              }
            } while( true );
          }
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

STATIC parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int32_t s1Len = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
#ifdef PARASAIL_ROWCOL
    int32_t offset = 0;
    int32_t position = 0;
#endif
    __m256i* restrict vProfile = NULL;
    __m256i* restrict vProfileM = NULL;
    __m256i* restrict vProfileS = NULL;
    __m256i* restrict pvHStore = NULL;
    __m256i* restrict pvHLoad = NULL;
    __m256i* restrict pvHMStore = NULL;
    __m256i* restrict pvHMLoad = NULL;
    __m256i* restrict pvHSStore = NULL;
    __m256i* restrict pvHSLoad = NULL;
    __m256i* restrict pvHLStore = NULL;
    __m256i* restrict pvHLLoad = NULL;
    __m256i* restrict pvE = NULL;
    __m256i* restrict pvEM = NULL;
    __m256i* restrict pvES = NULL;
    __m256i* restrict pvEL = NULL;
    __m256i* restrict pvHMax = NULL;
    __m256i* restrict pvHMMax = NULL;
    __m256i* restrict pvHSMax = NULL;
    __m256i* restrict pvHLMax = NULL;
    __m256i vGapO;
    __m256i vGapE;
    __m256i vZero;
    __m256i vOne;
    int8_t bias = 0;
    int8_t score = 0;
    int8_t matches = 0;
    int8_t similar = 0;
    int8_t length = 0;
    __m256i vBias;
    __m256i vBias1;
    __m256i vMaxH;
    __m256i vMaxHUnit;
    __m256i insert_mask;
    __m256i vSaturationCheckMax;
    __m256i vPosLimit;
    int8_t maxp = 0;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile8.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    end_query = 0;
    end_ref = 0;
    s1Len = profile->s1Len;
    matrix = profile->matrix;
    segWidth = 32; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
#ifdef PARASAIL_ROWCOL
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
#endif
    vProfile  = (__m256i*)profile->profile8.score;
    vProfileM = (__m256i*)profile->profile8.matches;
    vProfileS = (__m256i*)profile->profile8.similar;
    vGapO = _mm256_set1_epi8(open);
    vGapE = _mm256_set1_epi8(gap);
    vZero = _mm256_setzero_si256();
    vOne = _mm256_set1_epi8(1);
    bias = INT8_MIN;
    score = bias;
    matches = bias;
    similar = bias;
    length = bias;
    vBias = _mm256_set1_epi8(bias);
    vBias1 = _mm256_adds_epi8(vBias,vOne);
    vMaxH = vBias;
    vMaxHUnit = vBias;
    insert_mask = _mm256_cmpgt_epi8(
            _mm256_set_epi8(0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,1),
            vZero);
    vSaturationCheckMax = vBias;
    vPosLimit = _mm256_set1_epi8(INT8_MAX);
    maxp = INT8_MAX - (int8_t)(matrix->max+1);

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table3(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol3(segLen*segWidth, s2Len);
#else
    result = parasail_result_new_stats();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SW | PARASAIL_FLAG_STRIPED
        | PARASAIL_FLAG_STATS
        | PARASAIL_FLAG_BITS_8 | PARASAIL_FLAG_LANES_32;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvHStore  = parasail_memalign___m256i(32, segLen);
    pvHLoad   = parasail_memalign___m256i(32, segLen);
    pvHMStore = parasail_memalign___m256i(32, segLen);
    pvHMLoad  = parasail_memalign___m256i(32, segLen);
    pvHSStore = parasail_memalign___m256i(32, segLen);
    pvHSLoad  = parasail_memalign___m256i(32, segLen);
    pvHLStore = parasail_memalign___m256i(32, segLen);
    pvHLLoad  = parasail_memalign___m256i(32, segLen);
    pvE       = parasail_memalign___m256i(32, segLen);
    pvEM      = parasail_memalign___m256i(32, segLen);
    pvES      = parasail_memalign___m256i(32, segLen);
    pvEL      = parasail_memalign___m256i(32, segLen);
    pvHMax    = parasail_memalign___m256i(32, segLen);
    pvHMMax   = parasail_memalign___m256i(32, segLen);
    pvHSMax   = parasail_memalign___m256i(32, segLen);
    pvHLMax   = parasail_memalign___m256i(32, segLen);

    /* validate heap variables */
    if (!pvHStore) return NULL;
    if (!pvHLoad) return NULL;
    if (!pvHMStore) return NULL;
    if (!pvHMLoad) return NULL;
    if (!pvHSStore) return NULL;
    if (!pvHSLoad) return NULL;
    if (!pvHLStore) return NULL;
    if (!pvHLLoad) return NULL;
    if (!pvE) return NULL;
    if (!pvEM) return NULL;
    if (!pvES) return NULL;
    if (!pvEL) return NULL;
    if (!pvHMax) return NULL;
    if (!pvHMMax) return NULL;
    if (!pvHSMax) return NULL;
    if (!pvHLMax) return NULL;

    parasail_memset___m256i(pvHStore, vBias, segLen);
    parasail_memset___m256i(pvHMStore, vBias, segLen);
    parasail_memset___m256i(pvHSStore, vBias, segLen);
    parasail_memset___m256i(pvHLStore, vBias, segLen);
    parasail_memset___m256i(pvE, vBias, segLen);
    parasail_memset___m256i(pvEM, vBias, segLen);
    parasail_memset___m256i(pvES, vBias, segLen);
    parasail_memset___m256i(pvEL, vBias1, segLen);

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m256i vEF_opn;
        __m256i vE;
        __m256i vE_ext;
        __m256i vEM;
        __m256i vES;
        __m256i vEL;
        __m256i vF;
        __m256i vF_ext;
        __m256i vFM;
        __m256i vFS;
        __m256i vFL;
        __m256i vH;
        __m256i vH_dag;
        __m256i vHM;
        __m256i vHS;
        __m256i vHL;
        const __m256i* vP = NULL;
        const __m256i* vPM = NULL;
        const __m256i* vPS = NULL;

        /* Initialize F value to 0.  Any errors to vH values will be
         * corrected in the Lazy_F loop. */
        vF = vBias;
        vFM = vBias;
        vFS = vBias;
        vFL = vBias1;

        /* load final segment of pvHStore and shift left by 1 bytes */
        vH = _mm256_load_si256(&pvHStore[segLen - 1]);
        vHM = _mm256_load_si256(&pvHMStore[segLen - 1]);
        vHS = _mm256_load_si256(&pvHSStore[segLen - 1]);
        vHL = _mm256_load_si256(&pvHLStore[segLen - 1]);
        vH = _mm256_slli_si256_rpl(vH, 1);
        vHM = _mm256_slli_si256_rpl(vHM, 1);
        vHS = _mm256_slli_si256_rpl(vHS, 1);
        vHL = _mm256_slli_si256_rpl(vHL, 1);
        vH = _mm256_blendv_epi8(vH, vBias, insert_mask);
        vHM = _mm256_blendv_epi8(vHM, vBias, insert_mask);
        vHS = _mm256_blendv_epi8(vHS, vBias, insert_mask);
        vHL = _mm256_blendv_epi8(vHL, vBias, insert_mask);

        /* Correct part of the vProfile */
        vP = vProfile + matrix->mapper[(unsigned char)s2[j]] * segLen;
        vPM = vProfileM + matrix->mapper[(unsigned char)s2[j]] * segLen;
        vPS = vProfileS + matrix->mapper[(unsigned char)s2[j]] * segLen;

        if (end_ref == j-2) {
            /* Swap in the max buffer. */
            SWAP3(pvHMax,  pvHLoad,  pvHStore)
            SWAP3(pvHMMax, pvHMLoad, pvHMStore)
            SWAP3(pvHSMax, pvHSLoad, pvHSStore)
            SWAP3(pvHLMax, pvHLLoad, pvHLStore)
        }
        else {
            /* Swap the 2 H buffers. */
            SWAP(pvHLoad,  pvHStore)
            SWAP(pvHMLoad, pvHMStore)
            SWAP(pvHSLoad, pvHSStore)
            SWAP(pvHLLoad, pvHLStore)
        }

        /* inner loop to process the query sequence */
        for (i=0; i<segLen; ++i) {
            __m256i cond_zero;
            __m256i case1;
            __m256i case2;

            vE = _mm256_load_si256(pvE+ i);
            vEM = _mm256_load_si256(pvEM+ i);
            vES = _mm256_load_si256(pvES+ i);
            vEL = _mm256_load_si256(pvEL+ i);

            /* Get max from vH, vE and vF. */
            vH_dag = _mm256_adds_epi8(vH, _mm256_load_si256(vP + i));
            /*vH = _mm256_max_epi8(vH_dag, vBias);*/
            vH = _mm256_max_epi8(vH_dag, vE);
            vH = _mm256_max_epi8(vH, vF);
            /* Save vH values. */
            _mm256_store_si256(pvHStore + i, vH);
            cond_zero = _mm256_cmpeq_epi8(vH, vBias);

            case1 = _mm256_cmpeq_epi8(vH, vH_dag);
            case2 = _mm256_cmpeq_epi8(vH, vF);

            /* calculate vM */
            vHM = _mm256_blendv_epi8(
                    _mm256_blendv_epi8(vEM, vFM, case2),
                    _mm256_adds_epi8(vHM, _mm256_load_si256(vPM + i)), case1);
            vHM = _mm256_blendv_epi8(vHM, vBias, cond_zero);
            _mm256_store_si256(pvHMStore + i, vHM);

            /* calculate vS */
            vHS = _mm256_blendv_epi8(
                    _mm256_blendv_epi8(vES, vFS, case2),
                    _mm256_adds_epi8(vHS, _mm256_load_si256(vPS + i)), case1);
            vHS = _mm256_blendv_epi8(vHS, vBias, cond_zero);
            _mm256_store_si256(pvHSStore + i, vHS);

            /* calculate vL */
            vHL = _mm256_blendv_epi8(
                    _mm256_blendv_epi8(vEL, vFL, case2),
                    _mm256_adds_epi8(vHL, vOne), case1);
            vHL = _mm256_blendv_epi8(vHL, vBias, cond_zero);
            _mm256_store_si256(pvHLStore + i, vHL);

            vSaturationCheckMax = _mm256_max_epi8(vSaturationCheckMax, vHM);
            vSaturationCheckMax = _mm256_max_epi8(vSaturationCheckMax, vHS);
            vSaturationCheckMax = _mm256_max_epi8(vSaturationCheckMax, vHL);
#ifdef PARASAIL_TABLE
            arr_store(result->stats->tables->matches_table, vHM, i, segLen, j, s2Len, bias);
            arr_store(result->stats->tables->similar_table, vHS, i, segLen, j, s2Len, bias);
            arr_store(result->stats->tables->length_table, vHL, i, segLen, j, s2Len, bias);
            arr_store(result->stats->tables->score_table, vH, i, segLen, j, s2Len, bias);
#endif
            vMaxH = _mm256_max_epi8(vH, vMaxH);
            vEF_opn = _mm256_subs_epi8(vH, vGapO);

            /* Update vE value. */
            vE_ext = _mm256_subs_epi8(vE, vGapE);
            vE = _mm256_max_epi8(vEF_opn, vE_ext);
            case1 = _mm256_cmpgt_epi8(vEF_opn, vE_ext);
            vEM = _mm256_blendv_epi8(vEM, vHM, case1);
            vES = _mm256_blendv_epi8(vES, vHS, case1);
            vEL = _mm256_blendv_epi8(
                    _mm256_adds_epi8(vEL, vOne),
                    _mm256_adds_epi8(vHL, vOne),
                    case1);
            _mm256_store_si256(pvE + i, vE);
            _mm256_store_si256(pvEM + i, vEM);
            _mm256_store_si256(pvES + i, vES);
            _mm256_store_si256(pvEL + i, vEL);

            /* Update vF value. */
            vF_ext = _mm256_subs_epi8(vF, vGapE);
            vF = _mm256_max_epi8(vEF_opn, vF_ext);
            case1 = _mm256_cmpgt_epi8(vEF_opn, vF_ext);
            vFM = _mm256_blendv_epi8(vFM, vHM, case1);
            vFS = _mm256_blendv_epi8(vFS, vHS, case1);
            vFL = _mm256_blendv_epi8(
                    _mm256_adds_epi8(vFL, vOne),
                    _mm256_adds_epi8(vHL, vOne),
                    case1);

            /* Load the next vH. */
            vH = _mm256_load_si256(pvHLoad + i);
            vHM = _mm256_load_si256(pvHMLoad + i);
            vHS = _mm256_load_si256(pvHSLoad + i);
            vHL = _mm256_load_si256(pvHLLoad + i);
        }

        /* Lazy_F loop: has been revised to disallow adjecent insertion and
         * then deletion, so don't update E(i, i), learn from SWPS3 */
        for (k=0; k<segWidth; ++k) {
            __m256i vHp = _mm256_load_si256(&pvHLoad[segLen - 1]);
            vHp = _mm256_slli_si256_rpl(vHp, 1);
            vF = _mm256_slli_si256_rpl(vF, 1);
            vFM = _mm256_slli_si256_rpl(vFM, 1);
            vFS = _mm256_slli_si256_rpl(vFS, 1);
            vFL = _mm256_slli_si256_rpl(vFL, 1);
            vHp = _mm256_blendv_epi8(vHp, vBias, insert_mask);
            vF = _mm256_blendv_epi8(vF, vBias, insert_mask);
            vFM = _mm256_blendv_epi8(vFM, vBias, insert_mask);
            vFS = _mm256_blendv_epi8(vFS, vBias, insert_mask);
            vFL = _mm256_blendv_epi8(vFL, vBias1, insert_mask);
            for (i=0; i<segLen; ++i) {
                __m256i case1;
                __m256i case2;
                __m256i cond;

                vHp = _mm256_adds_epi8(vHp, _mm256_load_si256(vP + i));
                vH = _mm256_load_si256(pvHStore + i);
                vH = _mm256_max_epi8(vH, vF);
                _mm256_store_si256(pvHStore + i, vH);
                case1 = _mm256_cmpeq_epi8(vH, vHp);
                case2 = _mm256_cmpeq_epi8(vH, vF);
                cond = _mm256_andnot_si256(case1, case2);

                /* calculate vM */
                vHM = _mm256_load_si256(pvHMStore + i);
                vHM = _mm256_blendv_epi8(vHM, vFM, cond);
                _mm256_store_si256(pvHMStore + i, vHM);

                /* calculate vS */
                vHS = _mm256_load_si256(pvHSStore + i);
                vHS = _mm256_blendv_epi8(vHS, vFS, cond);
                _mm256_store_si256(pvHSStore + i, vHS);

                /* calculate vL */
                vHL = _mm256_load_si256(pvHLStore + i);
                vHL = _mm256_blendv_epi8(vHL, vFL, cond);
                _mm256_store_si256(pvHLStore + i, vHL);

                vSaturationCheckMax = _mm256_max_epi8(vSaturationCheckMax, vHM);
                vSaturationCheckMax = _mm256_max_epi8(vSaturationCheckMax, vHS);
                vSaturationCheckMax = _mm256_max_epi8(vSaturationCheckMax, vHL);
#ifdef PARASAIL_TABLE
                arr_store(result->stats->tables->matches_table, vHM, i, segLen, j, s2Len, bias);
                arr_store(result->stats->tables->similar_table, vHS, i, segLen, j, s2Len, bias);
                arr_store(result->stats->tables->length_table, vHL, i, segLen, j, s2Len, bias);
                arr_store(result->stats->tables->score_table, vH, i, segLen, j, s2Len, bias);
#endif
                vMaxH = _mm256_max_epi8(vH, vMaxH);
                /* Update vF value. */
                vEF_opn = _mm256_subs_epi8(vH, vGapO);
                vF_ext = _mm256_subs_epi8(vF, vGapE);
                if (! _mm256_movemask_epi8(
                            _mm256_or_si256(
                                _mm256_cmpgt_epi8(vF_ext, vEF_opn),
                                _mm256_and_si256(
                                    _mm256_cmpeq_epi8(vF_ext, vEF_opn),
                                    _mm256_cmpgt_epi8(vF_ext, vBias)))))
                    goto end;
                /*vF = _mm256_max_epi8(vEF_opn, vF_ext);*/
                vF = vF_ext;
                cond = _mm256_cmpgt_epi8(vEF_opn, vF_ext);
                vFM = _mm256_blendv_epi8(vFM, vHM, cond);
                vFS = _mm256_blendv_epi8(vFS, vHS, cond);
                vFL = _mm256_blendv_epi8(
                        _mm256_adds_epi8(vFL, vOne),
                        _mm256_adds_epi8(vHL, vOne),
                        cond);
                vHp = _mm256_load_si256(pvHLoad + i);
            }
        }
end:
        {
        }

#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            vH = _mm256_load_si256(pvHStore + offset);
            vHM = _mm256_load_si256(pvHMStore + offset);
            vHS = _mm256_load_si256(pvHSStore + offset);
            vHL = _mm256_load_si256(pvHLStore + offset);
            for (k=0; k<position; ++k) {
                vH = _mm256_slli_si256_rpl(vH, 1);
                vHM = _mm256_slli_si256_rpl(vHM, 1);
                vHS = _mm256_slli_si256_rpl(vHS, 1);
                vHL = _mm256_slli_si256_rpl(vHL, 1);
            }
            result->stats->rowcols->score_row[j] = (int8_t) _mm256_extract_epi8_rpl (vH, 31) - bias;
            result->stats->rowcols->matches_row[j] = (int8_t) _mm256_extract_epi8_rpl (vHM, 31) - bias;
            result->stats->rowcols->similar_row[j] = (int8_t) _mm256_extract_epi8_rpl (vHS, 31) - bias;
            result->stats->rowcols->length_row[j] = (int8_t) _mm256_extract_epi8_rpl (vHL, 31) - bias;
        }
#endif

        {
            __m256i vCompare = _mm256_cmpgt_epi8(vMaxH, vMaxHUnit);
            if (_mm256_movemask_epi8(vCompare)) {
                score = _mm256_hmax_epi8_rpl(vMaxH);
                /* if score has potential to overflow, abort early */
                if (score > maxp) {
                    result->flag |= PARASAIL_FLAG_SATURATED;
                    break;
                }
                vMaxHUnit = _mm256_set1_epi8(score);
                end_ref = j;
            }
        }
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m256i vH = _mm256_load_si256(pvHStore+i);
        __m256i vHM = _mm256_load_si256(pvHMStore+i);
        __m256i vHS = _mm256_load_si256(pvHSStore+i);
        __m256i vHL = _mm256_load_si256(pvHLStore+i);
        arr_store_col(result->stats->rowcols->score_col, vH, i, segLen, bias);
        arr_store_col(result->stats->rowcols->matches_col, vHM, i, segLen, bias);
        arr_store_col(result->stats->rowcols->similar_col, vHS, i, segLen, bias);
        arr_store_col(result->stats->rowcols->length_col, vHL, i, segLen, bias);
    }
#endif

    if (score == INT8_MAX
            || _mm256_movemask_epi8(_mm256_cmpeq_epi8(vSaturationCheckMax,vPosLimit))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
    }

    if (parasail_result_is_saturated(result)) {
        score = 0;
        end_query = 0;
        end_ref = 0;
        matches = 0;
        similar = 0;
        length = 0;
    }
    else {
        if (end_ref == j-1) {
            /* end_ref was the last store column */
            SWAP(pvHMax,  pvHStore)
            SWAP(pvHMMax, pvHMStore)
            SWAP(pvHSMax, pvHSStore)
            SWAP(pvHLMax, pvHLStore)
        }
        else if (end_ref == j-2) {
            /* end_ref was the last load column */
            SWAP(pvHMax,  pvHLoad)
            SWAP(pvHMMax, pvHMLoad)
            SWAP(pvHSMax, pvHSLoad)
            SWAP(pvHLMax, pvHLLoad)
        }
        /* Trace the alignment ending position on read. */
        {
            int8_t *t = (int8_t*)pvHMax;
            int8_t *m = (int8_t*)pvHMMax;
            int8_t *s = (int8_t*)pvHSMax;
            int8_t *l = (int8_t*)pvHLMax;
            int32_t column_len = segLen * segWidth;
            end_query = s1Len;
            for (i = 0; i<column_len; ++i, ++t, ++m, ++s, ++l) {
                if (*t == score) {
                    int32_t temp = i / segWidth + i % segWidth * segLen;
                    if (temp < end_query) {
                        end_query = temp;
                        matches = *m;
                        similar = *s;
                        length = *l;
                    }
                }
            }
        }
    }

    result->score = score - bias;
    result->end_query = end_query;
    result->end_ref = end_ref;
    result->stats->matches = matches - bias;
    result->stats->similar = similar - bias;
    result->stats->length = length - bias;

    parasail_free(pvHLMax);
    parasail_free(pvHSMax);
    parasail_free(pvHMMax);
    parasail_free(pvHMax);
    parasail_free(pvEL);
    parasail_free(pvES);
    parasail_free(pvEM);
    parasail_free(pvE);
    parasail_free(pvHLLoad);
    parasail_free(pvHLStore);
    parasail_free(pvHSLoad);
    parasail_free(pvHSStore);
    parasail_free(pvHMLoad);
    parasail_free(pvHMStore);
    parasail_free(pvHLoad);
    parasail_free(pvHStore);

    return result;
}